

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

string * __thiscall
Variable::getBindSimbol_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  bool bVar1;
  undefined8 *puVar2;
  Variable *this_local;
  
  bVar1 = std::operator==(&this->m_bind_to,"0");
  if (!bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_bind_to);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "var in not bind to sim";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

string Variable::getBindSimbol() {
  if (this->m_bind_to == "0") {
    throw "var in not bind to sim";
  } else {
    return this->m_bind_to;
  }
}